

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

void __thiscall
TPZMatrix<long_double>::AutoFill
          (TPZMatrix<long_double> *this,int64_t nrow,int64_t ncol,int symmetric)

{
  longdouble lVar1;
  longdouble lVar2;
  int iVar3;
  long lVar4;
  TPZMatrix<long_double> *pTVar5;
  TPZMatrix<long_double> *pTVar6;
  TPZMatrix<long_double> *pTVar7;
  longdouble in_ST0;
  longdouble lVar8;
  longdouble lVar9;
  longdouble in_ST1;
  longdouble lVar10;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble lVar11;
  longdouble in_ST5;
  longdouble lVar12;
  longdouble in_ST6;
  longdouble local_58;
  undefined1 local_48 [24];
  
  (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xd])();
  if (0 < (this->super_TPZBaseMatrix).fRow) {
    pTVar5 = (TPZMatrix<long_double> *)0x0;
    do {
      if (pTVar5 == (TPZMatrix<long_double> *)0x0 || symmetric == 0) {
        lVar10 = (longdouble)0;
        pTVar7 = (TPZMatrix<long_double> *)0x0;
      }
      else {
        lVar10 = (longdouble)0;
        pTVar6 = (TPZMatrix<long_double> *)0x0;
        lVar8 = in_ST0;
        lVar9 = in_ST1;
        lVar1 = in_ST2;
        lVar2 = in_ST3;
        lVar12 = in_ST4;
        do {
          in_ST4 = in_ST6;
          in_ST3 = in_ST5;
          in_ST2 = lVar12;
          in_ST1 = lVar2;
          in_ST0 = lVar1;
          in_ST5 = in_ST4;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,pTVar6,pTVar5)
          ;
          local_58 = lVar8;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,pTVar5,pTVar6,&local_58);
          nrow = (int64_t)pTVar5;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,pTVar5,pTVar6)
          ;
          lVar10 = lVar10 + ABS(lVar9);
          pTVar6 = (TPZMatrix<long_double> *)
                   ((long)&(pTVar6->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable + 1);
          pTVar7 = pTVar5;
          lVar8 = in_ST0;
          lVar9 = in_ST1;
          lVar1 = in_ST2;
          lVar2 = in_ST3;
          lVar12 = in_ST4;
          in_ST6 = in_ST5;
        } while (pTVar5 != pTVar6);
      }
      lVar4 = (this->super_TPZBaseMatrix).fCol;
      lVar8 = in_ST0;
      lVar9 = in_ST1;
      lVar1 = in_ST2;
      lVar2 = in_ST3;
      lVar12 = in_ST4;
      lVar11 = in_ST5;
      if ((long)pTVar7 < lVar4) {
        do {
          in_ST5 = in_ST6;
          in_ST4 = lVar11;
          in_ST3 = lVar12;
          in_ST2 = lVar2;
          in_ST1 = lVar1;
          in_ST0 = lVar9;
          GetRandomVal((longdouble *)this,(TPZMatrix<long_double> *)nrow);
          lVar8 = ABS(lVar8) + lVar10;
          if (pTVar5 == pTVar7) {
            lVar8 = lVar10;
          }
          lVar10 = lVar8;
          nrow = (int64_t)pTVar5;
          in_ST6 = in_ST5;
          iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                            (this,pTVar5,pTVar7,local_48);
          if (iVar3 == 0) {
            nrow = 0;
            Error("AutoFill (TPZMatrix) failed.",(char *)0x0);
          }
          pTVar7 = (TPZMatrix<long_double> *)
                   ((long)&(pTVar7->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable + 1);
          lVar4 = (this->super_TPZBaseMatrix).fCol;
          lVar8 = in_ST0;
          lVar9 = in_ST1;
          lVar1 = in_ST2;
          lVar2 = in_ST3;
          lVar12 = in_ST4;
          lVar11 = in_ST5;
        } while ((long)pTVar7 < lVar4);
      }
      lVar8 = in_ST1;
      lVar9 = in_ST2;
      lVar1 = in_ST3;
      lVar2 = in_ST4;
      lVar12 = in_ST5;
      if ((this->super_TPZBaseMatrix).fRow == lVar4) {
        nrow = (int64_t)pTVar5;
        lVar11 = in_ST5;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,pTVar5,pTVar5);
        if (ABS(in_ST0) < ABS(lVar10)) {
          local_58 = lVar10 + (longdouble)1;
          nrow = (int64_t)pTVar5;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,pTVar5,pTVar5,&local_58);
        }
        in_ST0 = in_ST1;
        lVar8 = in_ST2;
        lVar9 = in_ST3;
        lVar1 = in_ST4;
        lVar2 = in_ST5;
        lVar12 = lVar11;
        if ((ABS(lVar10) < (longdouble)1e-16) &&
           (nrow = (int64_t)pTVar5,
           (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                     (this,pTVar5,pTVar5), in_ST0 = in_ST2, lVar8 = in_ST3, lVar9 = in_ST4,
           lVar1 = in_ST5, lVar2 = lVar11, ABS(in_ST1) < (longdouble)1e-16)) {
          local_58 = (longdouble)1;
          nrow = (int64_t)pTVar5;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,pTVar5,pTVar5,&local_58);
          in_ST0 = in_ST2;
          lVar8 = in_ST3;
          lVar9 = in_ST4;
          lVar1 = in_ST5;
          lVar2 = lVar11;
        }
      }
      in_ST5 = lVar12;
      in_ST4 = lVar2;
      in_ST3 = lVar1;
      in_ST2 = lVar9;
      in_ST1 = lVar8;
      pTVar5 = (TPZMatrix<long_double> *)
               ((long)&(pTVar5->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable + 1);
      in_ST6 = in_ST5;
    } while ((long)pTVar5 < (this->super_TPZBaseMatrix).fRow);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::AutoFill(int64_t nrow, int64_t ncol, int symmetric) {
    Resize(nrow,ncol);
	int64_t i, j;
	TVar val, sum;
	/** Fill data */
	for(i=0;i<Rows();i++) {
		sum = 0.0;
        j=0;
        if (symmetric) {
            for (; j<i; j++) {
                if constexpr (is_complex<TVar>::value){
                    //hermitian matrices
                    PutVal(i, j, std::conj(GetVal(j,i)));
                }else{
                    PutVal(i, j, GetVal(j,i));
                }
                sum += fabs(GetVal(i, j));
            }
        }
		for(;j<Cols();j++) {
			val = GetRandomVal();
            if constexpr(is_complex<TVar>::value){
                if(j==i) val = fabs(val);
            }
            if(i!=j) sum += fabs(val);
			if(!PutVal(i,j,val))
				Error("AutoFill (TPZMatrix) failed.");
			
		}
		if (Rows() == Cols()) {
		  /** Making diagonally dominant and non zero in diagonal */
		  if(fabs(sum) > fabs(GetVal(i,i)))            // Deve satisfazer:  |Aii| > SUM( |Aij| )  sobre j != i
			  PutVal(i,i,sum+(TVar)1.);
		  // To sure diagonal is not zero.
		  if(IsZero(sum) && IsZero(GetVal(i,i)))
			  PutVal(i,i,1.);
		}
	}
}